

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBase2VS::Run(BasicStdLayoutBase2VS *this)

{
  CallLogWrapper *this_00;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  int j;
  long lVar7;
  long *plVar8;
  byte bVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data [4];
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  GLuint *local_a0;
  long local_98 [13];
  
  bVar2 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,8)
  ;
  lVar7 = 0x10;
  if (bVar2) {
    local_98[10] = 0;
    local_98[0xb] = 0;
    local_98[8] = 0;
    local_98[9] = 0;
    local_98[6] = 0;
    local_98[7] = 0;
    local_98[4] = 0;
    local_98[5] = 0;
    local_98[2] = 0;
    local_98[3] = 0;
    local_98[0] = 0;
    local_98[1] = 0;
    iVar3 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              _vptr_GLWrapper[9])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,(char *)CONCAT44(extraout_var,iVar3),&local_e1);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,0x1b3c1e9);
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_e0,&local_c0);
    this->m_program = GVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar7 = -1;
    if (bVar2) {
      local_a0 = this->m_buffer;
      glu::CallLogWrapper::glGenBuffers(this_00,8,local_a0);
      plVar8 = local_98 + 1;
      lVar7 = 0;
      do {
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,(GLuint)lVar7,this->m_buffer[lVar7]);
        glu::CallLogWrapper::glBufferData
                  (this_00,0x90d2,*plVar8 - plVar8[-1],(void *)plVar8[-1],0x88e4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,
                   *plVar8 - plVar8[-1],(allocator_type *)&local_c0);
        glu::CallLogWrapper::glBindBufferBase
                  (this_00,0x90d2,(GLuint)lVar7 + 4,this->m_buffer[lVar7 + 4]);
        glu::CallLogWrapper::glBufferData
                  (this_00,0x90d2,*plVar8 - plVar8[-1],local_e0._M_dataplus._M_p,0x88e4);
        if (local_e0._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_e0._M_dataplus._M_p,
                          local_e0.field_2._M_allocated_capacity - (long)local_e0._M_dataplus._M_p);
        }
        plVar8 = plVar8 + 3;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      bVar9 = 1;
      lVar7 = 0;
      do {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,
                   local_98[lVar7 * 3 + 1] - local_98[lVar7 * 3],(allocator_type *)&local_c0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,local_a0[lVar7 + 4]);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        plVar8 = local_98 + lVar7 * 3;
        glu::CallLogWrapper::glGetBufferSubData
                  (this_00,0x90d2,0,local_98[lVar7 * 3 + 1] - *plVar8,local_e0._M_dataplus._M_p);
        lVar5 = *plVar8;
        if (local_98[lVar7 * 3 + 1] != lVar5) {
          uVar6 = 0;
          do {
            if (*(char *)(lVar5 + uVar6) != local_e0._M_dataplus._M_p[uVar6]) {
              bVar9 = 0;
              anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n",uVar6 & 0xffffffff)
              ;
            }
            uVar6 = uVar6 + 1;
            lVar5 = *plVar8;
          } while (uVar6 < (ulong)(local_98[lVar7 * 3 + 1] - lVar5));
        }
        if (local_e0._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_e0._M_dataplus._M_p,
                          local_e0.field_2._M_allocated_capacity - (long)local_e0._M_dataplus._M_p);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar7 = -(ulong)(~bVar9 & 1);
    }
    lVar5 = 0x60;
    do {
      pvVar1 = *(void **)((long)&local_c0.field_2 + lVar5);
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,*(long *)((long)&local_a0 + lVar5) - (long)pvVar1);
      }
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != 0);
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(8))
			return NOT_SUPPORTED;
		std::vector<GLubyte> in_data[4];
		const char*			 glsl_vs = GetInput(in_data);

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(8, m_buffer);

		for (GLuint i = 0; i < 4; ++i)
		{
			// input buffers
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &in_data[i][0], GL_STATIC_DRAW);

			// output buffers
			std::vector<GLubyte> out_data(in_data[i].size());
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 4, m_buffer[i + 4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data[i].size(), &out_data[0], GL_STATIC_DRAW);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glEnable(GL_RASTERIZER_DISCARD);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		bool status = true;
		for (int j = 0; j < 4; ++j)
		{
			std::vector<GLubyte> out_data(in_data[j].size());
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[j + 4]);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data[j].size(), &out_data[0]);

			for (size_t i = 0; i < in_data[j].size(); ++i)
			{
				if (in_data[j][i] != out_data[i])
				{
					Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i],
						   in_data[j][i]);
					status = false;
				}
			}
		}
		if (!status)
			return ERROR;
		return NO_ERROR;
	}